

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O3

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
KmerCounter::get_count_by_name(KmerCounter *this,string *name)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  runtime_error *this_00;
  long lVar3;
  size_type *psVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (this->count_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->count_names).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 5;
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    psVar4 = &pbVar1->_M_string_length;
    lVar5 = 0;
    do {
      if (*psVar4 == __n) {
        if (__n == 0) {
LAB_001993df:
          return (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 ((long)(this->counts).
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - lVar5);
        }
        iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar4 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar2 == 0) goto LAB_001993df;
      }
      lVar5 = lVar5 + -0x18;
      psVar4 = psVar4 + 4;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Couldn\'t find a count named: ",name);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::vector<uint16_t> &KmerCounter::get_count_by_name(const std::string &name) const {
    for (int i = 0; i < count_names.size(); i++) {
        if (count_names[i] == name) {
            return counts[i];
        }
    }

    throw std::runtime_error("Couldn't find a count named: "+name);
}